

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O2

Am_Wrapper * color_from_panel_proc(Am_Object *param_1)

{
  int iVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  char *pcVar4;
  Am_Wrapper *pAVar5;
  Am_Style *this;
  Am_String s;
  Am_Value value;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = (Am_Value *)Am_Object::Get(0x85a0,0x169);
  Am_Value::operator=(&value,pAVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"Color Value = ");
  poVar3 = (ostream *)operator<<(poVar3,&value);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  if (value.type != 0x8008) {
    pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
    goto LAB_0010a496;
  }
  s.data = (Am_String_Data *)0x0;
  Am_String::operator=(&s,&value);
  pcVar4 = Am_String::operator_cast_to_char_(&s);
  if (pcVar4 == (char *)0x0) {
LAB_0010a459:
    this = (Am_Style *)&Am_White;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"new color = ");
    pcVar4 = Am_String::operator_cast_to_char_(&s);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    pcVar4 = Am_String::operator_cast_to_char_(&s);
    iVar1 = strcmp(pcVar4,"Red");
    if (iVar1 == 0) {
      this = (Am_Style *)&Am_Red;
    }
    else {
      pcVar4 = Am_String::operator_cast_to_char_(&s);
      iVar1 = strcmp(pcVar4,"Blue");
      if (iVar1 == 0) {
        this = (Am_Style *)&Am_Blue;
      }
      else {
        pcVar4 = Am_String::operator_cast_to_char_(&s);
        iVar1 = strcmp(pcVar4,"Green");
        if (iVar1 == 0) {
          this = (Am_Style *)&Am_Green;
        }
        else {
          pcVar4 = Am_String::operator_cast_to_char_(&s);
          iVar1 = strcmp(pcVar4,"Yellow");
          if (iVar1 == 0) {
            this = (Am_Style *)&Am_Yellow;
          }
          else {
            pcVar4 = Am_String::operator_cast_to_char_(&s);
            iVar1 = strcmp(pcVar4,"Orange");
            if (iVar1 != 0) goto LAB_0010a459;
            this = (Am_Style *)&Am_Orange;
          }
        }
      }
    }
  }
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(this);
  Am_String::~Am_String(&s);
LAB_0010a496:
  Am_Value::~Am_Value(&value);
  return pAVar5;
}

Assistant:

Am_Define_No_Self_Formula(bool, on_left_form)
{
  Am_Value value;
  // get the value from the checkbox widget's value.
  value = checkboxes.Peek(Am_VALUE);
  return !find_in_list(value, ON_RIGHT);
}